

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::SerializeWithCachedSizes(Model *this,CodedOutputStream *output)

{
  bool bVar1;
  int32 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Model *this_local;
  
  iVar2 = specificationversion(this);
  if (iVar2 != 0) {
    iVar2 = specificationversion(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  bVar1 = has_description(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->description_->super_MessageLite,output);
  }
  bVar1 = isupdatable(this);
  if (bVar1) {
    bVar1 = isupdatable(this);
    google::protobuf::internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  bVar1 = has_pipelineclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_pipelineregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xc9,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_pipeline(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xca,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_glmregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (300,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_supportvectorregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x12d,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_treeensembleregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x12e,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_neuralnetworkregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x12f,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_bayesianprobitregressor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x130,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_glmclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (400,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_supportvectorclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x191,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_treeensembleclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x192,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_neuralnetworkclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x193,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_knearestneighborsclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x194,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_neuralnetwork(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (500,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_itemsimilarityrecommender(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f5,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_custommodel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x22b,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_linkedmodel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x22c,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_onehotencoder(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (600,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_imputer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x259,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_featurevectorizer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x25a,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_dictvectorizer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x25b,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_scaler(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x25c,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_categoricalmapping(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x25e,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_normalizer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x25f,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_arrayfeatureextractor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x261,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_nonmaximumsuppression(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x262,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_identity(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (900,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_textclassifier(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2000,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_wordtagger(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x7d1,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_visionfeatureprint(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x7d2,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_soundanalysispreprocessing(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x7d3,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_gazetteer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x7d4,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_wordembedding(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x7d5,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  bVar1 = has_serializedmodel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3000,&((this->Type_).pipelineclassifier_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void Model::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Model)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 specificationVersion = 1;
  if (this->specificationversion() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->specificationversion(), output);
  }

  // .CoreML.Specification.ModelDescription description = 2;
  if (this->has_description()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->description_, output);
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->isupdatable(), output);
  }

  // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
  if (has_pipelineclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *Type_.pipelineclassifier_, output);
  }

  // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
  if (has_pipelineregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      201, *Type_.pipelineregressor_, output);
  }

  // .CoreML.Specification.Pipeline pipeline = 202;
  if (has_pipeline()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      202, *Type_.pipeline_, output);
  }

  // .CoreML.Specification.GLMRegressor glmRegressor = 300;
  if (has_glmregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      300, *Type_.glmregressor_, output);
  }

  // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
  if (has_supportvectorregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      301, *Type_.supportvectorregressor_, output);
  }

  // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
  if (has_treeensembleregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      302, *Type_.treeensembleregressor_, output);
  }

  // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
  if (has_neuralnetworkregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      303, *Type_.neuralnetworkregressor_, output);
  }

  // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
  if (has_bayesianprobitregressor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      304, *Type_.bayesianprobitregressor_, output);
  }

  // .CoreML.Specification.GLMClassifier glmClassifier = 400;
  if (has_glmclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      400, *Type_.glmclassifier_, output);
  }

  // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
  if (has_supportvectorclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      401, *Type_.supportvectorclassifier_, output);
  }

  // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
  if (has_treeensembleclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      402, *Type_.treeensembleclassifier_, output);
  }

  // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
  if (has_neuralnetworkclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      403, *Type_.neuralnetworkclassifier_, output);
  }

  // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
  if (has_knearestneighborsclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      404, *Type_.knearestneighborsclassifier_, output);
  }

  // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
  if (has_neuralnetwork()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      500, *Type_.neuralnetwork_, output);
  }

  // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
  if (has_itemsimilarityrecommender()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      501, *Type_.itemsimilarityrecommender_, output);
  }

  // .CoreML.Specification.CustomModel customModel = 555;
  if (has_custommodel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      555, *Type_.custommodel_, output);
  }

  // .CoreML.Specification.LinkedModel linkedModel = 556;
  if (has_linkedmodel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      556, *Type_.linkedmodel_, output);
  }

  // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
  if (has_onehotencoder()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      600, *Type_.onehotencoder_, output);
  }

  // .CoreML.Specification.Imputer imputer = 601;
  if (has_imputer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      601, *Type_.imputer_, output);
  }

  // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
  if (has_featurevectorizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      602, *Type_.featurevectorizer_, output);
  }

  // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
  if (has_dictvectorizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      603, *Type_.dictvectorizer_, output);
  }

  // .CoreML.Specification.Scaler scaler = 604;
  if (has_scaler()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      604, *Type_.scaler_, output);
  }

  // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
  if (has_categoricalmapping()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      606, *Type_.categoricalmapping_, output);
  }

  // .CoreML.Specification.Normalizer normalizer = 607;
  if (has_normalizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      607, *Type_.normalizer_, output);
  }

  // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
  if (has_arrayfeatureextractor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      609, *Type_.arrayfeatureextractor_, output);
  }

  // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
  if (has_nonmaximumsuppression()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      610, *Type_.nonmaximumsuppression_, output);
  }

  // .CoreML.Specification.Identity identity = 900;
  if (has_identity()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      900, *Type_.identity_, output);
  }

  // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
  if (has_textclassifier()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2000, *Type_.textclassifier_, output);
  }

  // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
  if (has_wordtagger()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2001, *Type_.wordtagger_, output);
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
  if (has_visionfeatureprint()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2002, *Type_.visionfeatureprint_, output);
  }

  // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
  if (has_soundanalysispreprocessing()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2003, *Type_.soundanalysispreprocessing_, output);
  }

  // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
  if (has_gazetteer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2004, *Type_.gazetteer_, output);
  }

  // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
  if (has_wordembedding()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2005, *Type_.wordembedding_, output);
  }

  // .CoreML.Specification.SerializedModel serializedModel = 3000;
  if (has_serializedmodel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3000, *Type_.serializedmodel_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Model)
}